

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O2

void __thiscall dit::BuildInfoStringCase::~BuildInfoStringCase(BuildInfoStringCase *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BuildInfoStringCase_0027de18;
  std::__cxx11::string::~string((string *)&this->m_value);
  std::__cxx11::string::~string((string *)&this->m_valueName);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BuildInfoStringCase (tcu::TestContext& testCtx, const char* name, const char* valueName, const char* value)
		: tcu::TestCase	(testCtx, name, valueName)
		, m_valueName	(valueName)
		, m_value		(value)
	{
	}